

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

int set_corn(level *lev,int x1,int y1,int x2,int y2,int x3,int y3,int x4,int y4)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int is_4;
  int is_3;
  int is_2;
  int is_1;
  int wmode;
  int x3_local;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  level *lev_local;
  
  iVar1 = check_pos(lev,x1,y1,1);
  iVar2 = check_pos(lev,x2,y2,1);
  iVar3 = check_pos(lev,x3,y3,1);
  iVar4 = check_pos(lev,x4,y4,1);
  if (iVar4 == 0) {
    if (((iVar1 == 0) || (iVar2 == 0)) || (iVar3 == 0)) {
      is_2 = 0;
    }
    else {
      is_2 = 1;
    }
  }
  else {
    is_2 = 2;
  }
  return is_2;
}

Assistant:

static int set_corn(struct level *lev, int x1, int y1, int x2, int y2,
		    int x3, int y3, int x4, int y4)
{
    int wmode, is_1, is_2, is_3, is_4;

    is_1 = check_pos(lev, x1, y1, 1);
    is_2 = check_pos(lev, x2, y2, 1);
    is_3 = check_pos(lev, x3, y3, 1);
    is_4 = check_pos(lev, x4, y4, 1);	/* inner location */

    /*
     * All 4 should not be true.  So if the inner location is rock,
     * use it.  If all of the outer 3 are true, use outer.  We currently
     * can't cover the case where only part of the outer is rock, so
     * we just say that all the walls are finished (if not overridden
     * by the inner section).
     */
    if (is_4) {
	wmode = WM_C_INNER;
    } else if (is_1 && is_2 && is_3)
	wmode = WM_C_OUTER;
     else
	wmode = 0;	/* finished walls on all sides */

    return wmode;
}